

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O0

void SendAbort(void)

{
  int local_14;
  int local_10;
  int j;
  int i;
  BYTE dis [2];
  
  j._2_2_ = 0x230;
  if (1 < doomcom.numnodes) {
    if (consoleplayer == 0) {
      for (local_10 = 1; local_10 < doomcom.numnodes; local_10 = local_10 + 1) {
        for (local_14 = 4; 0 < local_14; local_14 = local_14 + -1) {
          PreSend((void *)((long)&j + 2),2,sendaddress + local_10);
        }
      }
    }
    else {
      for (local_10 = 4; 0 < local_10; local_10 = local_10 + -1) {
        PreSend((void *)((long)&j + 2),2,sendaddress + 1);
      }
    }
  }
  return;
}

Assistant:

void SendAbort (void)
{
	BYTE dis[2] = { PRE_FAKE, PRE_DISCONNECT };
	int i, j;

	if (doomcom.numnodes > 1)
	{
		if (consoleplayer == 0)
		{
			// The host needs to let everyone know
			for (i = 1; i < doomcom.numnodes; ++i)
			{
				for (j = 4; j > 0; --j)
				{
					PreSend (dis, 2, &sendaddress[i]);
				}
			}
		}
		else
		{
			// Guests only need to let the host know.
			for (i = 4; i > 0; --i)
			{
				PreSend (dis, 2, &sendaddress[1]);
			}
		}
	}
}